

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O1

void __thiscall sf::priv::GlContext::cleanupUnsharedResources(GlContext *this)

{
  GlContext *pGVar1;
  _Rb_tree_node_base *p_Var2;
  GlContext *this_00;
  
  pGVar1 = (GlContext *)
           ThreadLocal::getValue
                     ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::currentContext);
  this_00 = (GlContext *)0x0;
  if (pGVar1 != this) {
    this_00 = pGVar1;
  }
  setActive(this,true);
  for (p_Var2 = (_Rb_tree_node_base *)
                (anonymous_namespace)::GlContextImpl::contextDestroyCallbacks._24_8_;
      p_Var2 != (_Rb_tree_node_base *)
                ((anonymous_namespace)::GlContextImpl::contextDestroyCallbacks + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    (**(code **)(p_Var2 + 1))(p_Var2[1]._M_parent);
  }
  if (this_00 == (GlContext *)0x0) {
    return;
  }
  setActive(this_00,true);
  return;
}

Assistant:

void GlContext::cleanupUnsharedResources()
{
    using GlContextImpl::currentContext;
    using GlContextImpl::ContextDestroyCallbacks;
    using GlContextImpl::contextDestroyCallbacks;

    // Save the current context so we can restore it later
    GlContext* contextToRestore = currentContext;

    // If this context is already active there is no need to save it
    if (contextToRestore == this)
        contextToRestore = NULL;

    // Make this context active so resources can be freed
    setActive(true);

    // Call the registered destruction callbacks
    for (ContextDestroyCallbacks::iterator iter = contextDestroyCallbacks.begin(); iter != contextDestroyCallbacks.end(); ++iter)
        iter->first(iter->second);

    // Make the originally active context active again
    if (contextToRestore)
        contextToRestore->setActive(true);
}